

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

void __thiscall
yactfr::internal::DsPktProc::addErProc
          (DsPktProc *this,
          unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
          *erProc)

{
  pointer this_00;
  EventRecordType *this_01;
  TypeId TVar1;
  size_type sVar2;
  reference this_02;
  mapped_type *this_03;
  size_type local_20;
  TypeId id;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> *erProc_local
  ;
  DsPktProc *this_local;
  
  id = (TypeId)erProc;
  erProc_local = (unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                  *)this;
  this_00 = std::
            unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
            operator->(erProc);
  this_01 = ErProc::ert(this_00);
  TVar1 = EventRecordType::id(this_01);
  local_20 = TVar1;
  sVar2 = std::
          vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
          ::size(&this->_erProcsVec);
  if (TVar1 < sVar2) {
    this_02 = std::
              vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
              ::operator[](&this->_erProcsVec,local_20);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    operator=(this_02,erProc);
  }
  else {
    this_03 = std::
              unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
              ::operator[](&this->_erProcsMap,&local_20);
    std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    operator=(this_03,erProc);
  }
  return;
}

Assistant:

void DsPktProc::addErProc(std::unique_ptr<ErProc> erProc)
{
    const auto id = erProc->ert().id();

    if (id < _erProcsVec.size()) {
        _erProcsVec[id] = std::move(erProc);
    } else {
        _erProcsMap[id] = std::move(erProc);
    }
}